

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  App app;
  allocator local_209;
  string local_208;
  App local_1e8;
  
  std::__cxx11::string::string((string *)&local_208,"...",&local_209);
  CLI::App::App(&local_1e8,&local_208);
  std::__cxx11::string::~string((string *)&local_208);
  setup_subcommand_a(&local_1e8);
  local_1e8.require_subcommand_min_ = 1;
  local_1e8.require_subcommand_max_ = 0;
  CLI::App::parse(&local_1e8,argc,argv);
  CLI::App::~App(&local_1e8);
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    CLI::App app{"..."};

    // Call the setup functions for the subcommands.
    // They are kept alive by a shared pointer in the
    // lambda function held by CLI11
    setup_subcommand_a(app);

    // Make sure we get at least one subcommand
    app.require_subcommand();

    // More setup if needed, i.e., other subcommands etc.

    CLI11_PARSE(app, argc, argv);

    return 0;
}